

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall QPDFJob::doJSONEncrypt(QPDFJob *this,Pipeline *p,bool *first,QPDF *pdf)

{
  QPDF *first_00;
  bool *p_00;
  bool bVar1;
  element_type *peVar2;
  char *__s;
  long lVar3;
  bool local_8c1;
  bool local_8b1;
  allocator<char> local_891;
  string local_890;
  JSON local_870;
  allocator<char> local_859;
  JSON local_858 [2];
  JSON local_838;
  JSON local_828;
  allocator<char> local_811;
  JSON local_810 [2];
  JSON local_7f0;
  JSON local_7e0;
  allocator<char> local_7c9;
  JSON local_7c8 [2];
  JSON local_7a8;
  JSON local_798;
  allocator<char> local_781;
  JSON local_780 [2];
  JSON local_760;
  undefined1 local_750 [8];
  string s_overall_method;
  string s_file_method;
  string s_string_method;
  string s_stream_method;
  undefined1 local_6c8 [6];
  anon_class_1_1_3296b2ed fix_method;
  JSON local_6a8;
  JSON local_698;
  allocator<char> local_681;
  JSON local_680 [2];
  JSON local_660;
  string local_650;
  JSON local_630;
  unsigned_long local_620;
  undefined1 local_618 [8];
  string encryption_key;
  JSON key;
  undefined1 local_5e0 [4];
  int bits;
  allocator<char> local_5c9;
  JSON local_5c8 [2];
  JSON local_5a8;
  JSON local_598;
  allocator<char> local_581;
  JSON local_580 [2];
  JSON local_560;
  JSON local_550;
  allocator<char> local_539;
  JSON local_538 [2];
  JSON local_518;
  JSON local_508;
  allocator<char> local_4f1;
  JSON local_4f0 [2];
  undefined1 local_4d0 [8];
  JSON j_parameters;
  allocator<char> local_4a9;
  JSON local_4a8 [2];
  JSON local_488;
  JSON local_478;
  allocator<char> local_461;
  JSON local_460 [2];
  JSON local_440;
  JSON local_430;
  JSON local_420;
  allocator<char> local_409;
  undefined1 local_408 [8];
  string MODIFY_ANNOTATIONS;
  allocator<char> local_3d1;
  JSON local_3d0 [2];
  JSON local_3b0;
  JSON local_3a0;
  allocator<char> local_389;
  JSON local_388 [2];
  JSON local_368;
  JSON local_358;
  allocator<char> local_341;
  JSON local_340 [2];
  JSON local_320;
  JSON local_310;
  allocator<char> local_2f9;
  JSON local_2f8 [2];
  JSON local_2d8;
  JSON local_2c8;
  allocator<char> local_2b1;
  JSON local_2b0 [2];
  JSON local_290;
  JSON local_280;
  allocator<char> local_269;
  JSON local_268 [2];
  JSON local_248;
  JSON local_238;
  allocator<char> local_221;
  JSON local_220 [2];
  undefined1 local_200 [8];
  JSON j_capabilities;
  allocator<char> local_1d9;
  JSON local_1d8 [2];
  JSON local_1b8;
  JSON local_1a8;
  allocator<char> local_191;
  JSON local_190 [2];
  JSON local_170;
  undefined1 local_160 [8];
  string user_password;
  allocator<char> local_129;
  JSON local_128 [2];
  JSON local_108;
  JSON local_f8;
  allocator<char> local_e1;
  JSON local_e0 [2];
  JSON local_c0;
  JSON local_b0 [2];
  allocator<char> local_89;
  JSON local_88 [2];
  JSON local_68;
  undefined1 local_58 [8];
  JSON j_encrypt;
  encryption_method_e local_40;
  undefined4 uStack_3c;
  bool is_encrypted;
  encryption_method_e file_method;
  encryption_method_e string_method;
  encryption_method_e stream_method;
  int V;
  int P;
  int R;
  QPDF *pdf_local;
  bool *first_local;
  Pipeline *p_local;
  QPDFJob *this_local;
  
  V = 0;
  stream_method = e_none;
  string_method = e_none;
  file_method = e_none;
  uStack_3c = e_none;
  local_40 = e_none;
  _P = pdf;
  pdf_local = (QPDF *)first;
  first_local = (bool *)p;
  p_local = (Pipeline *)this;
  j_encrypt.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_
       = QPDF::isEncrypted(pdf,&V,(int *)&stream_method,(int *)&string_method,&file_method,
                           &stack0xffffffffffffffc4,&local_40);
  JSON::makeDictionary();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_88,"encrypted",&local_89);
  JSON::makeBool(local_b0,(bool)(j_encrypt.m.
                                 super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi._7_1_ & 1));
  JSON::addDictionaryMember(&local_68,(string *)local_58,local_88);
  JSON::~JSON(&local_68);
  JSON::~JSON(local_b0);
  std::__cxx11::string::~string((string *)local_88);
  std::allocator<char>::~allocator(&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e0,"userpasswordmatched",&local_e1);
  local_8b1 = false;
  if ((j_encrypt.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
       _7_1_ & 1) != 0) {
    local_8b1 = QPDF::userPasswordMatched(_P);
  }
  JSON::makeBool(&local_f8,local_8b1);
  JSON::addDictionaryMember(&local_c0,(string *)local_58,local_e0);
  JSON::~JSON(&local_c0);
  JSON::~JSON(&local_f8);
  std::__cxx11::string::~string((string *)local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,"ownerpasswordmatched",&local_129);
  local_8c1 = false;
  if ((j_encrypt.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
       _7_1_ & 1) != 0) {
    local_8c1 = QPDF::ownerPasswordMatched(_P);
  }
  JSON::makeBool((JSON *)((long)&user_password.field_2 + 8),local_8c1);
  JSON::addDictionaryMember(&local_108,(string *)local_58,local_128);
  JSON::~JSON(&local_108);
  JSON::~JSON((JSON *)((long)&user_password.field_2 + 8));
  std::__cxx11::string::~string((string *)local_128);
  std::allocator<char>::~allocator(&local_129);
  if (((((j_encrypt.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi._7_1_ & 1) == 0) || (4 < (int)string_method)) ||
      (bVar1 = QPDF::ownerPasswordMatched(_P), !bVar1)) ||
     (bVar1 = QPDF::userPasswordMatched(_P), bVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1d8,"recovereduserpassword",&local_1d9);
    JSON::makeNull();
    JSON::addDictionaryMember(&local_1b8,(string *)local_58,local_1d8);
    JSON::~JSON(&local_1b8);
    JSON::~JSON((JSON *)&j_capabilities.m.
                         super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
  }
  else {
    QPDF::getTrimmedUserPassword_abi_cxx11_((string *)local_160,_P);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_190,"recovereduserpassword",&local_191);
    JSON::makeString(&local_1a8,(string *)local_160);
    JSON::addDictionaryMember(&local_170,(string *)local_58,local_190);
    JSON::~JSON(&local_170);
    JSON::~JSON(&local_1a8);
    std::__cxx11::string::~string((string *)local_190);
    std::allocator<char>::~allocator(&local_191);
    std::__cxx11::string::~string((string *)local_160);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_220,"capabilities",&local_221);
  JSON::makeDictionary();
  JSON::addDictionaryMember((JSON *)local_200,(string *)local_58,local_220);
  JSON::~JSON(&local_238);
  std::__cxx11::string::~string((string *)local_220);
  std::allocator<char>::~allocator(&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_268,"accessibility",&local_269)
  ;
  bVar1 = QPDF::allowAccessibility(_P);
  JSON::makeBool(&local_280,bVar1);
  JSON::addDictionaryMember(&local_248,(string *)local_200,local_268);
  JSON::~JSON(&local_248);
  JSON::~JSON(&local_280);
  std::__cxx11::string::~string((string *)local_268);
  std::allocator<char>::~allocator(&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_2b0,"extract",&local_2b1);
  bVar1 = QPDF::allowExtractAll(_P);
  JSON::makeBool(&local_2c8,bVar1);
  JSON::addDictionaryMember(&local_290,(string *)local_200,local_2b0);
  JSON::~JSON(&local_290);
  JSON::~JSON(&local_2c8);
  std::__cxx11::string::~string((string *)local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_2f8,"printlow",&local_2f9);
  bVar1 = QPDF::allowPrintLowRes(_P);
  JSON::makeBool(&local_310,bVar1);
  JSON::addDictionaryMember(&local_2d8,(string *)local_200,local_2f8);
  JSON::~JSON(&local_2d8);
  JSON::~JSON(&local_310);
  std::__cxx11::string::~string((string *)local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_340,"printhigh",&local_341);
  bVar1 = QPDF::allowPrintHighRes(_P);
  JSON::makeBool(&local_358,bVar1);
  JSON::addDictionaryMember(&local_320,(string *)local_200,local_340);
  JSON::~JSON(&local_320);
  JSON::~JSON(&local_358);
  std::__cxx11::string::~string((string *)local_340);
  std::allocator<char>::~allocator(&local_341);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_388,"modifyassembly",&local_389);
  bVar1 = QPDF::allowModifyAssembly(_P);
  JSON::makeBool(&local_3a0,bVar1);
  JSON::addDictionaryMember(&local_368,(string *)local_200,local_388);
  JSON::~JSON(&local_368);
  JSON::~JSON(&local_3a0);
  std::__cxx11::string::~string((string *)local_388);
  std::allocator<char>::~allocator(&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_3d0,"modifyforms",&local_3d1);
  bVar1 = QPDF::allowModifyForm(_P);
  JSON::makeBool((JSON *)((long)&MODIFY_ANNOTATIONS.field_2 + 8),bVar1);
  JSON::addDictionaryMember(&local_3b0,(string *)local_200,local_3d0);
  JSON::~JSON(&local_3b0);
  JSON::~JSON((JSON *)((long)&MODIFY_ANNOTATIONS.field_2 + 8));
  std::__cxx11::string::~string((string *)local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  __s = "modifyannotations";
  if (peVar2->json_version == 1) {
    __s = "moddifyannotations";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_408,__s,&local_409);
  std::allocator<char>::~allocator(&local_409);
  bVar1 = QPDF::allowModifyAnnotation(_P);
  JSON::makeBool(&local_430,bVar1);
  JSON::addDictionaryMember(&local_420,(string *)local_200,(JSON *)local_408);
  JSON::~JSON(&local_420);
  JSON::~JSON(&local_430);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_460,"modifyother",&local_461);
  bVar1 = QPDF::allowModifyOther(_P);
  JSON::makeBool(&local_478,bVar1);
  JSON::addDictionaryMember(&local_440,(string *)local_200,local_460);
  JSON::~JSON(&local_440);
  JSON::~JSON(&local_478);
  std::__cxx11::string::~string((string *)local_460);
  std::allocator<char>::~allocator(&local_461);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_4a8,"modify",&local_4a9);
  bVar1 = QPDF::allowModifyAll(_P);
  JSON::makeBool((JSON *)&j_parameters.m.
                          super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 bVar1);
  JSON::addDictionaryMember(&local_488,(string *)local_200,local_4a8);
  JSON::~JSON(&local_488);
  JSON::~JSON((JSON *)&j_parameters.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  std::__cxx11::string::~string((string *)local_4a8);
  std::allocator<char>::~allocator(&local_4a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_4f0,"parameters",&local_4f1);
  JSON::makeDictionary();
  JSON::addDictionaryMember((JSON *)local_4d0,(string *)local_58,local_4f0);
  JSON::~JSON(&local_508);
  std::__cxx11::string::~string((string *)local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_538,"R",&local_539);
  JSON::makeInt(&local_550,(long)V);
  JSON::addDictionaryMember(&local_518,(string *)local_4d0,local_538);
  JSON::~JSON(&local_518);
  JSON::~JSON(&local_550);
  std::__cxx11::string::~string((string *)local_538);
  std::allocator<char>::~allocator(&local_539);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_580,"V",&local_581);
  JSON::makeInt(&local_598,(long)(int)string_method);
  JSON::addDictionaryMember(&local_560,(string *)local_4d0,local_580);
  JSON::~JSON(&local_560);
  JSON::~JSON(&local_598);
  std::__cxx11::string::~string((string *)local_580);
  std::allocator<char>::~allocator(&local_581);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_5c8,"P",&local_5c9);
  JSON::makeInt((JSON *)local_5e0,(long)(int)stream_method);
  JSON::addDictionaryMember(&local_5a8,(string *)local_4d0,local_5c8);
  JSON::~JSON(&local_5a8);
  JSON::~JSON((JSON *)local_5e0);
  std::__cxx11::string::~string((string *)local_5c8);
  std::allocator<char>::~allocator(&local_5c9);
  key.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0;
  JSON::makeNull();
  if ((j_encrypt.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
       _7_1_ & 1) != 0) {
    QPDF::getEncryptionKey_abi_cxx11_((string *)local_618,_P);
    lVar3 = std::__cxx11::string::length();
    local_620 = lVar3 << 3;
    key.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         QIntC::to_int<unsigned_long>(&local_620);
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    if ((peVar2->show_encryption_key & 1U) != 0) {
      QUtil::hex_encode(&local_650,(string *)local_618);
      JSON::makeString(&local_630,&local_650);
      JSON::operator=((JSON *)((long)&encryption_key.field_2 + 8),&local_630);
      JSON::~JSON(&local_630);
      std::__cxx11::string::~string((string *)&local_650);
    }
    std::__cxx11::string::~string((string *)local_618);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_680,"bits",&local_681);
  JSON::makeInt(&local_698,
                (long)key.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi._4_4_);
  JSON::addDictionaryMember(&local_660,(string *)local_4d0,local_680);
  JSON::~JSON(&local_660);
  JSON::~JSON(&local_698);
  std::__cxx11::string::~string((string *)local_680);
  std::allocator<char>::~allocator(&local_681);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_6c8,"key",
             (allocator<char> *)(s_stream_method.field_2._M_local_buf + 0xf));
  JSON::addDictionaryMember(&local_6a8,(string *)local_4d0,(JSON *)local_6c8);
  JSON::~JSON(&local_6a8);
  std::__cxx11::string::~string((string *)local_6c8);
  std::allocator<char>::~allocator((allocator<char> *)(s_stream_method.field_2._M_local_buf + 0xf));
  s_stream_method.field_2._M_local_buf[0xe] =
       j_encrypt.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
       _7_1_ & 1;
  doJSONEncrypt::anon_class_1_1_3296b2ed::operator()
            ((anon_class_1_1_3296b2ed *)(s_stream_method.field_2._M_local_buf + 0xe),&file_method);
  doJSONEncrypt::anon_class_1_1_3296b2ed::operator()
            ((anon_class_1_1_3296b2ed *)(s_stream_method.field_2._M_local_buf + 0xe),
             &stack0xffffffffffffffc4);
  doJSONEncrypt::anon_class_1_1_3296b2ed::operator()
            ((anon_class_1_1_3296b2ed *)(s_stream_method.field_2._M_local_buf + 0xe),&local_40);
  show_encryption_method_abi_cxx11_((string *)((long)&s_string_method.field_2 + 8),file_method);
  show_encryption_method_abi_cxx11_((string *)((long)&s_file_method.field_2 + 8),uStack_3c);
  show_encryption_method_abi_cxx11_((string *)((long)&s_overall_method.field_2 + 8),local_40);
  std::__cxx11::string::string((string *)local_750);
  if ((file_method == uStack_3c) && (file_method == local_40)) {
    std::__cxx11::string::operator=
              ((string *)local_750,(string *)(s_string_method.field_2._M_local_buf + 8));
  }
  else {
    std::__cxx11::string::operator=((string *)local_750,"mixed");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_780,"method",&local_781);
  JSON::makeString(&local_798,(string *)local_750);
  JSON::addDictionaryMember(&local_760,(string *)local_4d0,local_780);
  JSON::~JSON(&local_760);
  JSON::~JSON(&local_798);
  std::__cxx11::string::~string((string *)local_780);
  std::allocator<char>::~allocator(&local_781);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_7c8,"streammethod",&local_7c9);
  JSON::makeString(&local_7e0,(string *)((long)&s_string_method.field_2 + 8));
  JSON::addDictionaryMember(&local_7a8,(string *)local_4d0,local_7c8);
  JSON::~JSON(&local_7a8);
  JSON::~JSON(&local_7e0);
  std::__cxx11::string::~string((string *)local_7c8);
  std::allocator<char>::~allocator(&local_7c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_810,"stringmethod",&local_811);
  JSON::makeString(&local_828,(string *)((long)&s_file_method.field_2 + 8));
  JSON::addDictionaryMember(&local_7f0,(string *)local_4d0,local_810);
  JSON::~JSON(&local_7f0);
  JSON::~JSON(&local_828);
  std::__cxx11::string::~string((string *)local_810);
  std::allocator<char>::~allocator(&local_811);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_858,"filemethod",&local_859);
  JSON::makeString(&local_870,(string *)((long)&s_overall_method.field_2 + 8));
  JSON::addDictionaryMember(&local_838,(string *)local_4d0,local_858);
  JSON::~JSON(&local_838);
  JSON::~JSON(&local_870);
  std::__cxx11::string::~string((string *)local_858);
  std::allocator<char>::~allocator(&local_859);
  p_00 = first_local;
  first_00 = pdf_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_890,"encrypt",&local_891);
  JSON::writeDictionaryItem((Pipeline *)p_00,(bool *)first_00,&local_890,(JSON *)local_58,1);
  std::__cxx11::string::~string((string *)&local_890);
  std::allocator<char>::~allocator(&local_891);
  std::__cxx11::string::~string((string *)local_750);
  std::__cxx11::string::~string((string *)(s_overall_method.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(s_file_method.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(s_string_method.field_2._M_local_buf + 8));
  JSON::~JSON((JSON *)((long)&encryption_key.field_2 + 8));
  JSON::~JSON((JSON *)local_4d0);
  std::__cxx11::string::~string((string *)local_408);
  JSON::~JSON((JSON *)local_200);
  JSON::~JSON((JSON *)local_58);
  return;
}

Assistant:

void
QPDFJob::doJSONEncrypt(Pipeline* p, bool& first, QPDF& pdf)
{
    int R = 0;
    int P = 0;
    int V = 0;
    QPDF::encryption_method_e stream_method = QPDF::e_none;
    QPDF::encryption_method_e string_method = QPDF::e_none;
    QPDF::encryption_method_e file_method = QPDF::e_none;
    bool is_encrypted = pdf.isEncrypted(R, P, V, stream_method, string_method, file_method);
    JSON j_encrypt = JSON::makeDictionary();
    j_encrypt.addDictionaryMember("encrypted", JSON::makeBool(is_encrypted));
    j_encrypt.addDictionaryMember(
        "userpasswordmatched", JSON::makeBool(is_encrypted && pdf.userPasswordMatched()));
    j_encrypt.addDictionaryMember(
        "ownerpasswordmatched", JSON::makeBool(is_encrypted && pdf.ownerPasswordMatched()));
    if (is_encrypted && (V < 5) && pdf.ownerPasswordMatched() && (!pdf.userPasswordMatched())) {
        std::string user_password = pdf.getTrimmedUserPassword();
        j_encrypt.addDictionaryMember("recovereduserpassword", JSON::makeString(user_password));
    } else {
        j_encrypt.addDictionaryMember("recovereduserpassword", JSON::makeNull());
    }
    JSON j_capabilities = j_encrypt.addDictionaryMember("capabilities", JSON::makeDictionary());
    j_capabilities.addDictionaryMember("accessibility", JSON::makeBool(pdf.allowAccessibility()));
    j_capabilities.addDictionaryMember("extract", JSON::makeBool(pdf.allowExtractAll()));
    j_capabilities.addDictionaryMember("printlow", JSON::makeBool(pdf.allowPrintLowRes()));
    j_capabilities.addDictionaryMember("printhigh", JSON::makeBool(pdf.allowPrintHighRes()));
    j_capabilities.addDictionaryMember("modifyassembly", JSON::makeBool(pdf.allowModifyAssembly()));
    j_capabilities.addDictionaryMember("modifyforms", JSON::makeBool(pdf.allowModifyForm()));
    /* cSpell:ignore moddifyannotations */
    std::string MODIFY_ANNOTATIONS =
        (m->json_version == 1 ? "moddifyannotations" : "modifyannotations");
    j_capabilities.addDictionaryMember(
        MODIFY_ANNOTATIONS, JSON::makeBool(pdf.allowModifyAnnotation()));
    j_capabilities.addDictionaryMember("modifyother", JSON::makeBool(pdf.allowModifyOther()));
    j_capabilities.addDictionaryMember("modify", JSON::makeBool(pdf.allowModifyAll()));
    JSON j_parameters = j_encrypt.addDictionaryMember("parameters", JSON::makeDictionary());
    j_parameters.addDictionaryMember("R", JSON::makeInt(R));
    j_parameters.addDictionaryMember("V", JSON::makeInt(V));
    j_parameters.addDictionaryMember("P", JSON::makeInt(P));
    int bits = 0;
    JSON key = JSON::makeNull();
    if (is_encrypted) {
        std::string encryption_key = pdf.getEncryptionKey();
        bits = QIntC::to_int(encryption_key.length() * 8);
        if (m->show_encryption_key) {
            key = JSON::makeString(QUtil::hex_encode(encryption_key));
        }
    }
    j_parameters.addDictionaryMember("bits", JSON::makeInt(bits));
    j_parameters.addDictionaryMember("key", key);
    auto fix_method = [is_encrypted](QPDF::encryption_method_e& method) {
        if (is_encrypted && method == QPDF::e_none) {
            method = QPDF::e_rc4;
        }
    };
    fix_method(stream_method);
    fix_method(string_method);
    fix_method(file_method);
    std::string s_stream_method = show_encryption_method(stream_method);
    std::string s_string_method = show_encryption_method(string_method);
    std::string s_file_method = show_encryption_method(file_method);
    std::string s_overall_method;
    if ((stream_method == string_method) && (stream_method == file_method)) {
        s_overall_method = s_stream_method;
    } else {
        s_overall_method = "mixed";
    }
    j_parameters.addDictionaryMember("method", JSON::makeString(s_overall_method));
    j_parameters.addDictionaryMember("streammethod", JSON::makeString(s_stream_method));
    j_parameters.addDictionaryMember("stringmethod", JSON::makeString(s_string_method));
    j_parameters.addDictionaryMember("filemethod", JSON::makeString(s_file_method));
    JSON::writeDictionaryItem(p, first, "encrypt", j_encrypt, 1);
}